

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O2

void __thiscall
slang::parsing::Preprocessor::predefine(Preprocessor *this,string *definition,string_view name)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  value_type_pointer ppVar3;
  ulong uVar4;
  int iVar5;
  bool bVar6;
  byte bVar7;
  uint uVar8;
  uint64_t hash;
  flat_hash_map<std::string_view,_MacroDef> *this_00;
  ulong pos0;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  raw_key_type *k;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>
  *args;
  undefined1 auVar12 [16];
  uchar uVar13;
  uchar uVar14;
  uchar uVar15;
  byte bVar16;
  uchar uVar17;
  uchar uVar18;
  uchar uVar19;
  byte bVar20;
  uchar uVar21;
  uchar uVar22;
  uchar uVar23;
  byte bVar24;
  uchar uVar25;
  uchar uVar26;
  uchar uVar27;
  byte bVar28;
  string_view source;
  Token TVar29;
  iterator __begin2;
  Preprocessor pp;
  iterator local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  uchar local_3e8;
  uchar uStack_3e7;
  uchar uStack_3e6;
  byte bStack_3e5;
  uchar uStack_3e4;
  uchar uStack_3e3;
  uchar uStack_3e2;
  byte bStack_3e1;
  uchar uStack_3e0;
  uchar uStack_3df;
  uchar uStack_3de;
  byte bStack_3dd;
  uchar uStack_3dc;
  uchar uStack_3db;
  uchar uStack_3da;
  byte bStack_3d9;
  uchar local_3d8;
  uchar uStack_3d7;
  uchar uStack_3d6;
  byte bStack_3d5;
  uchar uStack_3d4;
  uchar uStack_3d3;
  uchar uStack_3d2;
  byte bStack_3d1;
  uchar uStack_3d0;
  uchar uStack_3cf;
  uchar uStack_3ce;
  byte bStack_3cd;
  uchar uStack_3cc;
  uchar uStack_3cb;
  uchar uStack_3ca;
  byte bStack_3c9;
  Preprocessor local_3c8;
  
  Preprocessor(&local_3c8,this);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_428,
                 "`define ",definition);
  std::operator+(&local_408,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_428,
                 "\n");
  source._M_str = local_408._M_dataplus._M_p;
  source._M_len = local_408._M_string_length;
  pushSource(&local_3c8,source,name);
  std::__cxx11::string::~string((string *)&local_408);
  std::__cxx11::string::~string((string *)&local_428);
  do {
    TVar29 = consume(&local_3c8);
  } while (TVar29.kind != EndOfFile);
  local_428 = boost::unordered::detail::foa::
              table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>_>
              ::begin(&local_3c8.macros.table_);
  this_00 = &this->macros;
  args = local_428.p_;
  do {
    if (args == (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>
                 *)0x0) {
      ~Preprocessor(&local_3c8);
      return;
    }
    if ((args->second).intrinsic == None) {
      (args->second).commandLine = true;
      hash = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                       ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)this_00
                        ,&args->first);
      pos0 = hash >> ((byte)(this_00->table_).
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
                            .arrays.groups_size_index & 0x3f);
      lVar10 = (hash & 0xff) * 4;
      uVar13 = (&UNK_0043a38c)[lVar10];
      uVar14 = (&UNK_0043a38d)[lVar10];
      uVar15 = (&UNK_0043a38e)[lVar10];
      bVar16 = (&UNK_0043a38f)[lVar10];
      uVar9 = 0;
      uVar11 = pos0;
      uVar17 = uVar13;
      uVar18 = uVar14;
      uVar19 = uVar15;
      bVar20 = bVar16;
      uVar21 = uVar13;
      uVar22 = uVar14;
      uVar23 = uVar15;
      bVar24 = bVar16;
      uVar25 = uVar13;
      uVar26 = uVar14;
      uVar27 = uVar15;
      bVar28 = bVar16;
      do {
        pgVar2 = (this->macros).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
                 .arrays.groups_;
        pgVar1 = pgVar2 + uVar11;
        local_3d8 = pgVar1->m[0].n;
        uStack_3d7 = pgVar1->m[1].n;
        uStack_3d6 = pgVar1->m[2].n;
        bStack_3d5 = pgVar1->m[3].n;
        uStack_3d4 = pgVar1->m[4].n;
        uStack_3d3 = pgVar1->m[5].n;
        uStack_3d2 = pgVar1->m[6].n;
        bStack_3d1 = pgVar1->m[7].n;
        uStack_3d0 = pgVar1->m[8].n;
        uStack_3cf = pgVar1->m[9].n;
        uStack_3ce = pgVar1->m[10].n;
        bStack_3cd = pgVar1->m[0xb].n;
        uStack_3cc = pgVar1->m[0xc].n;
        uStack_3cb = pgVar1->m[0xd].n;
        uStack_3ca = pgVar1->m[0xe].n;
        bVar7 = pgVar1->m[0xf].n;
        auVar12[0] = -(local_3d8 == uVar13);
        auVar12[1] = -(uStack_3d7 == uVar14);
        auVar12[2] = -(uStack_3d6 == uVar15);
        auVar12[3] = -(bStack_3d5 == bVar16);
        auVar12[4] = -(uStack_3d4 == uVar17);
        auVar12[5] = -(uStack_3d3 == uVar18);
        auVar12[6] = -(uStack_3d2 == uVar19);
        auVar12[7] = -(bStack_3d1 == bVar20);
        auVar12[8] = -(uStack_3d0 == uVar21);
        auVar12[9] = -(uStack_3cf == uVar22);
        auVar12[10] = -(uStack_3ce == uVar23);
        auVar12[0xb] = -(bStack_3cd == bVar24);
        auVar12[0xc] = -(uStack_3cc == uVar25);
        auVar12[0xd] = -(uStack_3cb == uVar26);
        auVar12[0xe] = -(uStack_3ca == uVar27);
        auVar12[0xf] = -(bVar7 == bVar28);
        uVar8 = (uint)(ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) |
                               (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
                               (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                               (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                               (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                               (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                               (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                               (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                               (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                               (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                               (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                               (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                               (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                               (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe);
        bStack_3c9 = bVar7;
        if (uVar8 != 0) {
          ppVar3 = (this->macros).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
                   .arrays.elements_;
          local_3e8 = uVar13;
          uStack_3e7 = uVar14;
          uStack_3e6 = uVar15;
          bStack_3e5 = bVar16;
          uStack_3e4 = uVar17;
          uStack_3e3 = uVar18;
          uStack_3e2 = uVar19;
          bStack_3e1 = bVar20;
          uStack_3e0 = uVar21;
          uStack_3df = uVar22;
          uStack_3de = uVar23;
          bStack_3dd = bVar24;
          uStack_3dc = uVar25;
          uStack_3db = uVar26;
          uStack_3da = uVar27;
          bStack_3d9 = bVar28;
          do {
            iVar5 = 0;
            if (uVar8 != 0) {
              for (; (uVar8 >> iVar5 & 1) == 0; iVar5 = iVar5 + 1) {
              }
            }
            bVar6 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                    operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                               this_00,&args->first,
                               (basic_string_view<char,_std::char_traits<char>_> *)
                               ((long)&ppVar3[uVar11 * 0xf].first._M_len + (ulong)(uint)(iVar5 << 5)
                               ));
            if (bVar6) goto LAB_001eab94;
            uVar8 = uVar8 - 1 & uVar8;
          } while (uVar8 != 0);
          bVar7 = pgVar2[uVar11].m[0xf].n;
          uVar13 = local_3e8;
          uVar14 = uStack_3e7;
          uVar15 = uStack_3e6;
          bVar16 = bStack_3e5;
          uVar17 = uStack_3e4;
          uVar18 = uStack_3e3;
          uVar19 = uStack_3e2;
          bVar20 = bStack_3e1;
          uVar21 = uStack_3e0;
          uVar22 = uStack_3df;
          uVar23 = uStack_3de;
          bVar24 = bStack_3dd;
          uVar25 = uStack_3dc;
          uVar26 = uStack_3db;
          uVar27 = uStack_3da;
          bVar28 = bStack_3d9;
        }
        if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & bVar7) == 0) break;
        uVar4 = (this->macros).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
                .arrays.groups_size_mask;
        lVar10 = uVar11 + uVar9;
        uVar9 = uVar9 + 1;
        uVar11 = lVar10 + 1U & uVar4;
      } while (uVar9 <= uVar4);
      if ((this->macros).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
          .size_ctrl.size <
          (this->macros).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
          .size_ctrl.ml) {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::MacroDef>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::MacroDef>>>
        ::
        unchecked_emplace_at<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::MacroDef>const&>
                  ((locator *)&local_408,
                   (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::MacroDef>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::MacroDef>>>
                    *)this_00,pos0,hash,args);
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::MacroDef>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::MacroDef>>>
        ::
        unchecked_emplace_with_rehash<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::MacroDef>const&>
                  ((locator *)&local_408,
                   (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::MacroDef>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::MacroDef>>>
                    *)this_00,hash,args);
      }
    }
LAB_001eab94:
    boost::unordered::detail::foa::
    table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
    ::increment(&local_428);
    args = local_428.p_;
  } while( true );
}

Assistant:

void Preprocessor::predefine(const std::string& definition, std::string_view name) {
    Preprocessor pp(*this);
    pp.pushSource("`define " + definition + "\n", name);

    // Consume all of the definition text.
    while (pp.next().kind != TokenKind::EndOfFile) {
        // Nothing to do but keep going.
    }

    // Look for the macro in the temporary preprocessor's macro map.
    // Any macros found that are not the built-in intrinsic macros should
    // be copied over to our own map.
    for (auto& pair : pp.macros) {
        if (!pair.second.isIntrinsic()) {
            pair.second.commandLine = true;
            macros.insert(pair);
        }
    }
}